

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Point3f pbrt::SampleSphericalRectangle
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point2f *u,Float *pdf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  int iVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar59 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  Point3f PVar66;
  float local_1cc;
  float local_1c4;
  uint local_1b8;
  undefined1 local_178 [16];
  undefined1 local_108 [16];
  undefined1 local_b8 [16];
  uint local_88;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  
  fVar31 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar22 = ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar31)),auVar22,auVar22);
  auVar33 = ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar22 = vfmadd213ss_fma(auVar33,auVar33,auVar22);
  if (auVar22._0_4_ < 0.0) {
    fVar31 = sqrtf(auVar22._0_4_);
  }
  else {
    auVar22 = vsqrtss_avx(auVar22,auVar22);
    fVar31 = auVar22._0_4_;
  }
  fVar53 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar22 = ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar53)),auVar22,auVar22);
  auVar33 = ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar22 = vfmadd213ss_fma(auVar33,auVar33,auVar22);
  if (auVar22._0_4_ < 0.0) {
    fVar53 = sqrtf(auVar22._0_4_);
  }
  else {
    auVar22 = vsqrtss_avx(auVar22,auVar22);
    fVar53 = auVar22._0_4_;
  }
  fVar57 = (ex->super_Tuple3<pbrt::Vector3,_float>).x / fVar31;
  auVar43 = ZEXT416((uint)fVar57);
  fVar55 = (ey->super_Tuple3<pbrt::Vector3,_float>).x / fVar53;
  auVar34 = ZEXT416((uint)fVar55);
  uVar1 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar6 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar22._4_4_ = uVar6;
  auVar22._0_4_ = uVar1;
  auVar22._8_8_ = 0;
  auVar33._4_4_ = fVar31;
  auVar33._0_4_ = fVar31;
  auVar33._8_4_ = fVar31;
  auVar33._12_4_ = fVar31;
  auVar22 = vdivps_avx(auVar22,auVar33);
  auVar47 = vmovshdup_avx(auVar22);
  uVar2 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar7 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar46._4_4_ = uVar7;
  auVar46._0_4_ = uVar2;
  auVar46._8_8_ = 0;
  auVar52._4_4_ = fVar53;
  auVar52._0_4_ = fVar53;
  auVar52._8_4_ = fVar53;
  auVar52._12_4_ = fVar53;
  auVar33 = vdivps_avx(auVar46,auVar52);
  auVar35 = vmovshdup_avx(auVar33);
  auVar46 = vinsertps_avx(auVar47,auVar43,0x10);
  fVar62 = auVar33._0_4_;
  auVar20._0_4_ = fVar62 * auVar46._0_4_;
  auVar20._4_4_ = auVar33._4_4_ * auVar46._4_4_;
  auVar20._8_4_ = auVar33._8_4_ * auVar46._8_4_;
  auVar20._12_4_ = auVar33._12_4_ * auVar46._12_4_;
  auVar52 = vinsertps_avx(auVar35,auVar34,0x10);
  auVar52 = vfmsub213ps_fma(auVar52,auVar22,auVar20);
  auVar46 = vfnmadd213ps_fma(auVar46,auVar33,auVar20);
  auVar63._0_4_ = auVar52._0_4_ + auVar46._0_4_;
  auVar63._4_4_ = auVar52._4_4_ + auVar46._4_4_;
  auVar63._8_4_ = auVar52._8_4_ + auVar46._8_4_;
  auVar63._12_4_ = auVar52._12_4_ + auVar46._12_4_;
  fVar60 = auVar22._0_4_;
  auVar46 = vfmsub213ss_fma(auVar33,auVar43,ZEXT416((uint)(fVar60 * fVar55)));
  auVar52 = vfnmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar55)),auVar22,auVar34);
  fVar32 = auVar46._0_4_ + auVar52._0_4_;
  fVar45 = (s->super_Tuple3<pbrt::Point3,_float>).x - (pRef->super_Tuple3<pbrt::Point3,_float>).x;
  fVar54 = (s->super_Tuple3<pbrt::Point3,_float>).y - (pRef->super_Tuple3<pbrt::Point3,_float>).y;
  fVar51 = (s->super_Tuple3<pbrt::Point3,_float>).z - (pRef->super_Tuple3<pbrt::Point3,_float>).z;
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar54)),ZEXT416((uint)fVar45),auVar43);
  auVar52 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar51),auVar47);
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar62 * fVar54)),ZEXT416((uint)fVar45),auVar34);
  auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar51),auVar35);
  fVar41 = auVar46._0_4_;
  auVar46 = vmovshdup_avx(auVar63);
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * fVar54)),auVar63,ZEXT416((uint)fVar45));
  auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar32),ZEXT416((uint)fVar51));
  auVar47._0_8_ = auVar46._0_8_ ^ 0x8000000080000000;
  auVar47._8_4_ = auVar46._8_4_ ^ 0x80000000;
  auVar47._12_4_ = auVar46._12_4_ ^ 0x80000000;
  if (-auVar46._0_4_ < auVar46._0_4_) {
    uVar17 = CONCAT44(auVar63._4_4_,auVar63._0_4_);
    auVar63._0_8_ = uVar17 ^ 0x8000000080000000;
    auVar63._8_4_ = -auVar63._8_4_;
    auVar63._12_4_ = -auVar63._12_4_;
  }
  auVar35 = vminss_avx(auVar47,auVar46);
  fVar50 = auVar52._0_4_;
  fVar31 = fVar31 + fVar50;
  fVar53 = fVar53 + fVar41;
  fVar42 = auVar35._0_4_;
  fVar61 = fVar41 * fVar42;
  auVar48 = ZEXT416((uint)fVar41);
  auVar20 = vfmsub213ss_fma(auVar35,auVar48,ZEXT416((uint)fVar61));
  auVar19._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
  auVar19._8_4_ = auVar35._8_4_ ^ 0x80000000;
  auVar19._12_4_ = auVar35._12_4_ ^ 0x80000000;
  auVar34 = vfnmadd213ss_fma(auVar48,auVar35,ZEXT416((uint)fVar61));
  fVar45 = auVar20._0_4_ + auVar34._0_4_;
  fVar58 = fVar50 * fVar42;
  auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar31),auVar35,ZEXT416((uint)fVar58));
  auVar43 = vfnmadd213ss_fma(auVar35,auVar52,ZEXT416((uint)fVar58));
  fVar54 = auVar20._0_4_ + auVar43._0_4_;
  fVar51 = fVar41 * fVar31;
  auVar64._0_4_ = -fVar51;
  auVar64._4_4_ = 0x80000000;
  auVar64._8_4_ = 0x80000000;
  auVar64._12_4_ = 0x80000000;
  auVar20 = vfmsub213ss_fma(auVar48,auVar52,ZEXT416((uint)fVar51));
  auVar48 = vfnmadd231ss_fma(ZEXT416((uint)fVar51),auVar48,ZEXT416((uint)fVar31));
  fVar51 = auVar48._0_4_ + auVar20._0_4_;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar54 * fVar54)),ZEXT416((uint)fVar45),
                            ZEXT416((uint)fVar45));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar51),ZEXT416((uint)fVar51));
  if (auVar20._0_4_ < 0.0) {
    fVar28 = sqrtf(auVar20._0_4_);
  }
  else {
    auVar20 = vsqrtss_avx(auVar20,auVar20);
    fVar28 = auVar20._0_4_;
  }
  local_108._4_4_ = 0x80000000;
  local_108._0_4_ = -fVar61;
  local_108._8_4_ = 0x80000000;
  local_108._12_4_ = 0x80000000;
  local_178._4_4_ = 0x80000000;
  local_178._0_4_ = -fVar58;
  local_178._8_4_ = 0x80000000;
  local_178._12_4_ = 0x80000000;
  fVar61 = fVar53 * fVar42;
  auVar59._0_4_ = -fVar61;
  auVar59._4_4_ = 0x80000000;
  auVar59._8_4_ = 0x80000000;
  auVar59._12_4_ = 0x80000000;
  auVar15 = vfmsub132ss_fma(auVar35,ZEXT416((uint)fVar61),ZEXT416((uint)fVar41));
  auVar20 = vfmadd213ss_fma(auVar19,ZEXT416((uint)fVar53),ZEXT416((uint)fVar61));
  fVar61 = auVar20._0_4_ + auVar15._0_4_;
  fVar58 = fVar31 * fVar42;
  auVar65._0_4_ = -fVar58;
  auVar65._4_4_ = 0x80000000;
  auVar65._8_4_ = 0x80000000;
  auVar65._12_4_ = 0x80000000;
  auVar49 = ZEXT416((uint)fVar31);
  auVar19 = vfmsub213ss_fma(auVar49,auVar35,ZEXT416((uint)fVar58));
  auVar15 = vfnmadd231ss_fma(ZEXT416((uint)fVar58),auVar49,auVar35);
  fVar58 = auVar15._0_4_ + auVar19._0_4_;
  auVar19 = vfmadd231ss_fma(auVar64,auVar49,ZEXT416((uint)fVar53));
  fVar56 = auVar19._0_4_ + auVar48._0_4_;
  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * fVar58)),ZEXT416((uint)fVar61),
                            ZEXT416((uint)fVar61));
  auVar48 = vfmadd231ss_fma(auVar48,ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
  if (auVar48._0_4_ < 0.0) {
    fVar29 = sqrtf(auVar48._0_4_);
  }
  else {
    auVar48 = vsqrtss_avx(auVar48,auVar48);
    fVar29 = auVar48._0_4_;
  }
  auVar64 = ZEXT416((uint)fVar53);
  auVar48 = vfmadd231ss_fma(auVar59,auVar64,auVar35);
  fVar25 = auVar20._0_4_ + auVar48._0_4_;
  auVar20 = vfmadd231ss_fma(auVar65,auVar35,auVar52);
  fVar26 = auVar20._0_4_ + auVar15._0_4_;
  fVar27 = fVar50 * fVar53;
  auVar48._8_4_ = 0x80000000;
  auVar48._0_8_ = 0x8000000080000000;
  auVar48._12_4_ = 0x80000000;
  auVar19 = vxorps_avx512vl(ZEXT416((uint)fVar27),auVar48);
  auVar20 = vfmsub132ss_fma(auVar64,ZEXT416((uint)fVar27),ZEXT416((uint)fVar31));
  auVar48 = vfnmadd231ss_fma(ZEXT416((uint)fVar27),auVar64,auVar52);
  fVar27 = auVar48._0_4_ + auVar20._0_4_;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar26)),ZEXT416((uint)fVar25),
                            ZEXT416((uint)fVar25));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
  if (auVar20._0_4_ < 0.0) {
    fVar23 = sqrtf(auVar20._0_4_);
  }
  else {
    auVar20 = vsqrtss_avx(auVar20,auVar20);
    fVar23 = auVar20._0_4_;
  }
  fVar45 = fVar45 / fVar28;
  fVar54 = fVar54 / fVar28;
  fVar51 = fVar51 / fVar28;
  fVar61 = fVar61 / fVar29;
  fVar58 = fVar58 / fVar29;
  fVar56 = fVar56 / fVar29;
  auVar20 = vfmadd231ss_fma(local_108,ZEXT416((uint)fVar53),auVar35);
  fVar28 = auVar20._0_4_ + auVar34._0_4_;
  auVar35 = vfmadd231ss_fma(local_178,auVar35,auVar52);
  fVar29 = auVar35._0_4_ + auVar43._0_4_;
  auVar35 = vfmadd231ss_fma(auVar19,auVar52,ZEXT416((uint)fVar41));
  fVar30 = auVar35._0_4_ + auVar48._0_4_;
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar28),
                            ZEXT416((uint)fVar28));
  auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
  if (auVar35._0_4_ < 0.0) {
    fVar24 = sqrtf(auVar35._0_4_);
  }
  else {
    auVar35 = vsqrtss_avx(auVar35,auVar35);
    fVar24 = auVar35._0_4_;
  }
  fVar25 = fVar25 / fVar23;
  fVar26 = fVar26 / fVar23;
  auVar34._0_4_ = fVar27 / fVar23;
  auVar34._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar35 = vfnmsub231ss_fma(ZEXT416((uint)(fVar58 * fVar54)),ZEXT416((uint)fVar45),
                             ZEXT416((uint)fVar61));
  auVar35 = vfnmadd231ss_fma(auVar35,ZEXT416((uint)fVar51),ZEXT416((uint)fVar56));
  if (0.0 <= auVar35._0_4_) {
    auVar35 = vfmadd231ss_fma(ZEXT416((uint)((fVar58 + fVar54) * (fVar58 + fVar54))),
                              ZEXT416((uint)(fVar61 + fVar45)),ZEXT416((uint)(fVar61 + fVar45)));
    auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)(fVar51 + fVar56)),
                              ZEXT416((uint)(fVar51 + fVar56)));
    if (auVar35._0_4_ < 0.0) {
      fVar27 = sqrtf(auVar35._0_4_);
    }
    else {
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      fVar27 = auVar35._0_4_;
    }
    auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar27 * 0.5)));
    uVar12 = vcmpss_avx512f(ZEXT416((uint)(fVar27 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar12 & 1);
    fVar27 = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar35._0_4_));
    fVar27 = fVar27 + fVar27;
  }
  else {
    auVar35 = vfmadd231ss_fma(ZEXT416((uint)((fVar58 - fVar54) * (fVar58 - fVar54))),
                              ZEXT416((uint)(fVar61 - fVar45)),ZEXT416((uint)(fVar61 - fVar45)));
    auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)(fVar56 - fVar51)),
                              ZEXT416((uint)(fVar56 - fVar51)));
    if (auVar35._0_4_ < 0.0) {
      fVar27 = sqrtf(auVar35._0_4_);
    }
    else {
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      fVar27 = auVar35._0_4_;
    }
    auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar27 * 0.5)));
    uVar12 = vcmpss_avx512f(ZEXT416((uint)(fVar27 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar12 & 1);
    auVar36._0_4_ = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar35._0_4_));
    auVar36._4_60_ = extraout_var;
    auVar35 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar36._0_16_,ZEXT416(0x40490fdb));
    fVar27 = auVar35._0_4_;
  }
  fVar28 = fVar28 / fVar24;
  fVar29 = fVar29 / fVar24;
  fVar30 = fVar30 / fVar24;
  auVar35 = vfnmsub231ss_fma(ZEXT416((uint)(fVar26 * fVar58)),ZEXT416((uint)fVar61),
                             ZEXT416((uint)fVar25));
  auVar35 = vfnmadd231ss_fma(auVar35,ZEXT416((uint)fVar56),auVar34);
  if (0.0 <= auVar35._0_4_) {
    auVar35 = vfmadd231ss_fma(ZEXT416((uint)((fVar26 + fVar58) * (fVar26 + fVar58))),
                              ZEXT416((uint)(fVar25 + fVar61)),ZEXT416((uint)(fVar25 + fVar61)));
    auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)(fVar56 + auVar34._0_4_)),
                              ZEXT416((uint)(fVar56 + auVar34._0_4_)));
    if (auVar35._0_4_ < 0.0) {
      fVar61 = sqrtf(auVar35._0_4_);
    }
    else {
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      fVar61 = auVar35._0_4_;
    }
    auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar61 * 0.5)));
    uVar12 = vcmpss_avx512f(ZEXT416((uint)(fVar61 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar12 & 1);
    fVar61 = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar35._0_4_));
    fVar61 = fVar61 + fVar61;
  }
  else {
    auVar35 = vfmadd231ss_fma(ZEXT416((uint)((fVar26 - fVar58) * (fVar26 - fVar58))),
                              ZEXT416((uint)(fVar25 - fVar61)),ZEXT416((uint)(fVar25 - fVar61)));
    auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)(auVar34._0_4_ - fVar56)),
                              ZEXT416((uint)(auVar34._0_4_ - fVar56)));
    if (auVar35._0_4_ < 0.0) {
      fVar61 = sqrtf(auVar35._0_4_);
    }
    else {
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      fVar61 = auVar35._0_4_;
    }
    auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar61 * 0.5)));
    uVar12 = vcmpss_avx512f(ZEXT416((uint)(fVar61 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar12 & 1);
    auVar37._0_4_ = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar35._0_4_));
    auVar37._4_60_ = extraout_var_00;
    auVar35 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar37._0_16_,ZEXT416(0x40490fdb));
    fVar61 = auVar35._0_4_;
  }
  auVar35 = vfnmsub231ss_fma(ZEXT416((uint)(fVar29 * fVar26)),ZEXT416((uint)fVar25),
                             ZEXT416((uint)fVar28));
  auVar35 = vfnmadd231ss_fma(auVar35,auVar34,ZEXT416((uint)fVar30));
  if (0.0 <= auVar35._0_4_) {
    auVar35 = vfmadd231ss_fma(ZEXT416((uint)((fVar26 + fVar29) * (fVar26 + fVar29))),
                              ZEXT416((uint)(fVar25 + fVar28)),ZEXT416((uint)(fVar25 + fVar28)));
    auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)(auVar34._0_4_ + fVar30)),
                              ZEXT416((uint)(auVar34._0_4_ + fVar30)));
    if (auVar35._0_4_ < 0.0) {
      fVar58 = sqrtf(auVar35._0_4_);
    }
    else {
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      fVar58 = auVar35._0_4_;
    }
    auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar58 * 0.5)));
    uVar12 = vcmpss_avx512f(ZEXT416((uint)(fVar58 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar12 & 1);
    local_1cc = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar35._0_4_));
    local_1cc = local_1cc + local_1cc;
  }
  else {
    auVar35 = vfmadd231ss_fma(ZEXT416((uint)((fVar29 - fVar26) * (fVar29 - fVar26))),
                              ZEXT416((uint)(fVar28 - fVar25)),ZEXT416((uint)(fVar28 - fVar25)));
    auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)(fVar30 - auVar34._0_4_)),
                              ZEXT416((uint)(fVar30 - auVar34._0_4_)));
    if (auVar35._0_4_ < 0.0) {
      fVar58 = sqrtf(auVar35._0_4_);
    }
    else {
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      fVar58 = auVar35._0_4_;
    }
    auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar58 * 0.5)));
    uVar12 = vcmpss_avx512f(ZEXT416((uint)(fVar58 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar12 & 1);
    auVar38._0_4_ = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar35._0_4_));
    auVar38._4_60_ = extraout_var_01;
    auVar35 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar38._0_16_,ZEXT416(0x40490fdb));
    local_1cc = auVar35._0_4_;
  }
  auVar35 = vfnmsub231ss_fma(ZEXT416((uint)(fVar54 * fVar29)),ZEXT416((uint)fVar28),
                             ZEXT416((uint)fVar45));
  auVar35 = vfnmadd231ss_fma(auVar35,ZEXT416((uint)fVar30),ZEXT416((uint)fVar51));
  if (0.0 <= auVar35._0_4_) {
    auVar35 = vfmadd231ss_fma(ZEXT416((uint)((fVar54 + fVar29) * (fVar54 + fVar29))),
                              ZEXT416((uint)(fVar45 + fVar28)),ZEXT416((uint)(fVar45 + fVar28)));
    auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)(fVar51 + fVar30)),
                              ZEXT416((uint)(fVar51 + fVar30)));
    if (auVar35._0_4_ < 0.0) {
      fVar45 = sqrtf(auVar35._0_4_);
    }
    else {
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      fVar45 = auVar35._0_4_;
    }
    auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar45 * 0.5)));
    uVar12 = vcmpss_avx512f(ZEXT416((uint)(fVar45 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar12 & 1);
    local_1c4 = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar35._0_4_));
    local_1c4 = local_1c4 + local_1c4;
  }
  else {
    auVar35 = vfmadd231ss_fma(ZEXT416((uint)((fVar54 - fVar29) * (fVar54 - fVar29))),
                              ZEXT416((uint)(fVar45 - fVar28)),ZEXT416((uint)(fVar45 - fVar28)));
    auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)(fVar51 - fVar30)),
                              ZEXT416((uint)(fVar51 - fVar30)));
    if (auVar35._0_4_ < 0.0) {
      fVar45 = sqrtf(auVar35._0_4_);
    }
    else {
      auVar35 = vsqrtss_avx(auVar35,auVar35);
      fVar45 = auVar35._0_4_;
    }
    auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar45 * 0.5)));
    uVar12 = vcmpss_avx512f(ZEXT416((uint)(fVar45 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar14 = (bool)((byte)uVar12 & 1);
    auVar39._0_4_ = asinf((float)((uint)bVar14 * -0x40800000 + (uint)!bVar14 * auVar35._0_4_));
    auVar39._4_60_ = extraout_var_02;
    auVar35 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar39._0_16_,ZEXT416(0x40490fdb));
    local_1c4 = auVar35._0_4_;
  }
  if (SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
      ::reg == '\0') {
    iVar18 = __cxa_guard_acquire(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
                                  ::reg);
    if (iVar18 != 0) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
                  ::reg,SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::
                        Point3<float>const&,pbrt::Vector3<float>const&,pbrt::
                        Vector3<float>const&,pbrt::Point2<float>const&,float*)::$_0::__invoke(pbrt::
                        StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
                           ::reg);
    }
  }
  dVar11 = (double)fVar27 + (double)fVar61 + (double)local_1cc + (double)local_1c4 +
           -6.2831854820251465;
  auVar35._0_4_ = (float)dVar11;
  auVar35._4_4_ = (int)((ulong)dVar11 >> 0x20);
  auVar35._8_8_ = 0;
  *(long *)(in_FS_OFFSET + -0x448) = *(long *)(in_FS_OFFSET + -0x448) + 1;
  if (auVar35._0_4_ <= 0.0) {
    *(long *)(in_FS_OFFSET + -0x450) = *(long *)(in_FS_OFFSET + -0x450) + 1;
    if (pdf != (Float *)0x0) {
      *pdf = 0.0;
    }
    fVar45 = (u->super_Tuple2<pbrt::Point2,_float>).x;
    fVar31 = (u->super_Tuple2<pbrt::Point2,_float>).y;
    fVar32 = fVar45 * (ex->super_Tuple3<pbrt::Vector3,_float>).x +
             (s->super_Tuple3<pbrt::Point3,_float>).x +
             fVar31 * (ey->super_Tuple3<pbrt::Vector3,_float>).x;
    uVar12._0_4_ = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
    uVar12._4_4_ = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
  }
  else {
    if (pdf != (Float *)0x0) {
      auVar43._0_4_ = 1.0 / auVar35._0_4_;
      auVar43._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar20 = vmaxss_avx(auVar43,ZEXT816(0) << 0x40);
      *pdf = auVar20._0_4_;
    }
    fVar45 = (u->super_Tuple2<pbrt::Point2,_float>).x;
    if (0.001 <= auVar35._0_4_) {
      auVar15._8_4_ = 0x80000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar15._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(auVar34,auVar15);
      auVar35 = vfmsub213ss_fma(auVar35,ZEXT416((uint)fVar45),ZEXT416((uint)local_1cc));
      local_1c4 = auVar35._0_4_ - local_1c4;
      auVar40._0_4_ = cosf(local_1c4);
      auVar40._4_60_ = extraout_var_03;
      local_1b8 = auVar20._0_4_;
      auVar35 = vfmadd213ss_fma(auVar40._0_16_,ZEXT416((uint)fVar51),ZEXT416(local_1b8));
      fVar54 = sinf(local_1c4);
      fVar54 = auVar35._0_4_ / fVar54;
      fVar45 = fVar51 * fVar51 + fVar54 * fVar54;
      if (fVar45 < 0.0) {
        fVar45 = sqrtf(fVar45);
      }
      else {
        auVar35 = vsqrtss_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45));
        fVar45 = auVar35._0_4_;
      }
      auVar49._8_4_ = 0x7fffffff;
      auVar49._0_8_ = 0x7fffffff7fffffff;
      auVar49._12_4_ = 0x7fffffff;
      auVar20 = vpternlogd_avx512vl(ZEXT416((uint)fVar54),ZEXT416((uint)(1.0 / fVar45)),auVar49,0xd8
                                   );
      auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar20);
      uVar12 = vcmpss_avx512f(auVar20,SUB6416(ZEXT464(0xbf7fffff),0),1);
      bVar14 = (bool)((byte)uVar12 & 1);
      auVar21._4_12_ = auVar35._4_12_;
      auVar21._0_4_ = (float)((uint)bVar14 * -0x40800001 + (uint)!bVar14 * auVar35._0_4_);
      auVar16._8_4_ = 0x80000000;
      auVar16._0_8_ = 0x8000000080000000;
      auVar16._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(auVar21,auVar16);
      auVar35 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar21._0_4_ * auVar21._0_4_)),ZEXT816(0) << 0x40);
      if (auVar35._0_4_ < 0.0) {
        fVar45 = sqrtf(auVar35._0_4_);
      }
      else {
        auVar35 = vsqrtss_avx(auVar35,auVar35);
        fVar45 = auVar35._0_4_;
      }
      auVar35 = ZEXT416((uint)((auVar20._0_4_ * fVar42) / fVar45));
      local_88 = (uint)auVar47._0_8_;
      uVar12 = vcmpss_avx512f(auVar46,ZEXT416(local_88),0xe);
      auVar46 = vminss_avx(ZEXT416((uint)fVar31),auVar35);
      uVar13 = vcmpss_avx512f(auVar35,auVar52,1);
      bVar14 = (bool)((byte)uVar13 & 1);
      fVar45 = (float)((uint)bVar14 * (int)fVar50 + (uint)!bVar14 * auVar46._0_4_);
      fVar31 = fVar42 * fVar42 + fVar45 * fVar45;
      if (fVar31 < 0.0) {
        fVar31 = sqrtf(fVar31);
      }
      else {
        auVar46 = vsqrtss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31));
        fVar31 = auVar46._0_4_;
      }
      local_b8 = ZEXT416((uint)((byte)uVar12 & 1) * (int)-fVar32 +
                         (uint)!(bool)((byte)uVar12 & 1) * (int)fVar32);
      fVar32 = fVar41 * fVar41 + fVar31 * fVar31;
      if (fVar32 < 0.0) {
        fVar32 = sqrtf(fVar32);
      }
      else {
        auVar46 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
        fVar32 = auVar46._0_4_;
      }
      fVar54 = fVar53 * fVar53 + fVar31 * fVar31;
      if (fVar54 < 0.0) {
        fVar54 = sqrtf(fVar54);
      }
      else {
        auVar46 = vsqrtss_avx(ZEXT416((uint)fVar54),ZEXT416((uint)fVar54));
        fVar54 = auVar46._0_4_;
      }
      auVar46 = vfmadd132ss_fma(ZEXT416((uint)(fVar53 / fVar54 - fVar41 / fVar32)),
                                ZEXT416((uint)(fVar41 / fVar32)),
                                ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).y));
      fVar32 = auVar46._0_4_;
      if (fVar32 * fVar32 < 0.999999) {
        fVar53 = 1.0 - fVar32 * fVar32;
        if (fVar53 < 0.0) {
          fVar53 = sqrtf(fVar53);
        }
        else {
          auVar46 = vsqrtss_avx(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53));
          fVar53 = auVar46._0_4_;
        }
        fVar53 = (fVar32 * fVar31) / fVar53;
      }
      fStack_64 = auVar22._4_4_;
      fStack_60 = auVar22._8_4_;
      fStack_5c = auVar22._12_4_;
      fVar32 = auVar63._0_4_ * fVar42 + fVar45 * fVar57 + fVar53 * fVar55 +
               (pRef->super_Tuple3<pbrt::Point3,_float>).x;
      auVar22 = vpermi2ps_avx512vl(_DAT_004bc8f0,auVar63,local_b8);
      uVar5 = (pRef->super_Tuple3<pbrt::Point3,_float>).y;
      uVar10 = (pRef->super_Tuple3<pbrt::Point3,_float>).z;
      auVar44._0_4_ = (float)uVar5 + auVar22._0_4_ * fVar42 + fVar45 * fVar60 + fVar53 * fVar62;
      auVar44._4_4_ =
           (float)uVar10 + auVar22._4_4_ * fVar42 + fVar45 * fStack_64 + fVar53 * auVar33._4_4_;
      auVar44._8_4_ = auVar22._8_4_ * fVar42 + fVar45 * fStack_60 + fVar53 * auVar33._8_4_ + 0.0;
      auVar44._12_4_ = auVar22._12_4_ * fVar42 + fVar45 * fStack_5c + fVar53 * auVar33._12_4_ + 0.0;
      goto LAB_002df93f;
    }
    fVar31 = (u->super_Tuple2<pbrt::Point2,_float>).y;
    fVar32 = fVar45 * (ex->super_Tuple3<pbrt::Vector3,_float>).x +
             (s->super_Tuple3<pbrt::Point3,_float>).x +
             fVar31 * (ey->super_Tuple3<pbrt::Vector3,_float>).x;
    uVar12._0_4_ = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
    uVar12._4_4_ = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
  }
  uVar3 = (s->super_Tuple3<pbrt::Point3,_float>).y;
  uVar8 = (s->super_Tuple3<pbrt::Point3,_float>).z;
  uVar4 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar9 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar44._0_4_ = fVar45 * (float)uVar12 + (float)uVar3 + fVar31 * (float)uVar4;
  auVar44._4_4_ = fVar45 * (float)((ulong)uVar12 >> 0x20) + (float)uVar8 + fVar31 * (float)uVar9;
  auVar44._8_4_ = fVar45 * 0.0 + 0.0 + fVar31 * 0.0;
  auVar44._12_4_ = fVar45 * 0.0 + 0.0 + fVar31 * 0.0;
LAB_002df93f:
  auVar22 = vinsertps_avx(ZEXT416((uint)fVar32),auVar44,0x1c);
  auVar33 = vmovshdup_avx(auVar44);
  PVar66.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar22._0_8_;
  PVar66.super_Tuple3<pbrt::Point3,_float>.z = auVar33._0_4_;
  return (Point3f)PVar66.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f SampleSphericalRectangle(const Point3f &pRef, const Point3f &s,
                                 const Vector3f &ex, const Vector3f &ey, const Point2f &u,
                                 Float *pdf) {
    // Compute local reference frame and transform rectangle coordinates
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);
    Vector3f dLocal = R.ToLocal(s - pRef);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float x0 = dLocal.x, y0 = dLocal.y;
    Float x1 = x0 + exl, y1 = y0 + eyl;

    // Find plane normals to rectangle edges and compute internal angles
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);
    Vector3f n0 = Normalize(Cross(v00, v10)), n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01)), n3 = Normalize(Cross(v01, v00));
    Float g0 = AngleBetween(-n0, n1), g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3), g3 = AngleBetween(-n3, n0);

    // Compute spherical rectangle solid angle and PDF
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;
    CHECK_RARE(1e-5, solidAngle <= 0);
    if (solidAngle <= 0) {
        if (pdf != nullptr)
            *pdf = 0;
        return Point3f(s + u[0] * ex + u[1] * ey);
    }
    if (pdf != nullptr)
        *pdf = std::max<Float>(0, 1 / solidAngle);
    if (solidAngle < 1e-3)
        return Point3f(s + u[0] * ex + u[1] * ey);

    // Sample _cu_ for spherical rectangle sample
    Float b0 = n0.z, b1 = n2.z;
    // Float au = u[0] * solidAngle + k;   // original
    Float au = u[0] * solidAngle - g2 - g3;
    Float fu = (std::cos(au) * b0 - b1) / std::sin(au);
    Float cu = std::copysign(1 / std::sqrt(Sqr(fu) + Sqr(b0)), fu);
    cu = Clamp(cu, -OneMinusEpsilon, OneMinusEpsilon);  // avoid NaNs

    // Find _xu_ along $x$ edge for spherical rectangle sample
    Float xu = -(cu * z0) / SafeSqrt(1 - Sqr(cu));
    xu = Clamp(xu, x0, x1);

    // Find _xv_ along $y$ edge for spherical rectangle sample
    Float dd = std::sqrt(Sqr(xu) + Sqr(z0));
    Float h0 = y0 / std::sqrt(Sqr(dd) + Sqr(y0));
    Float h1 = y1 / std::sqrt(Sqr(dd) + Sqr(y1));
    Float hv = h0 + u[1] * (h1 - h0), hvsq = Sqr(hv);
    Float yv = (hvsq < 1 - 1e-6f) ? (hv * dd) / std::sqrt(1 - hvsq) : y1;

    // Return spherical triangle sample in original coordinate system
    return pRef + R.FromLocal(Vector3f(xu, yv, z0));
}